

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_affixutils.cpp
# Opt level: O2

bool icu_63::number::impl::AffixUtils::containsOnlySymbolsAndIgnorables
               (UnicodeString *affixPattern,UnicodeSet *ignorables,UErrorCode *status)

{
  short sVar1;
  bool bVar2;
  UBool UVar3;
  int iVar4;
  UErrorCode *in_R8;
  AffixTag tag;
  AffixTag AVar5;
  AffixTag local_40;
  
  AVar5 = local_40;
  sVar1 = (affixPattern->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar4 = (affixPattern->fUnion).fFields.fLength;
  }
  else {
    iVar4 = (int)sVar1 >> 5;
  }
  if (iVar4 == 0) {
    bVar2 = true;
  }
  else {
    local_40._0_8_ = local_40._4_8_ << 0x20;
    local_40.type = AVar5.type;
    local_40.state = STATE_BASE;
    AVar5 = local_40;
    do {
      do {
        bVar2 = hasNext(&local_40,affixPattern);
        if (!bVar2) goto LAB_0024c9c1;
        tag._8_8_ = affixPattern;
        tag.offset = (int)AVar5._8_8_;
        tag.codePoint = (int)((ulong)AVar5._8_8_ >> 0x20);
        AVar5 = nextToken(AVar5._0_8_,tag,(UnicodeString *)status,in_R8);
        if (U_ZERO_ERROR < *status) goto LAB_0024c9c1;
        local_40 = AVar5;
      } while (AVar5._8_8_ >> 0x20 != 0);
      UVar3 = UnicodeSet::contains(ignorables,AVar5.codePoint);
    } while (UVar3 != '\0');
LAB_0024c9c1:
    bVar2 = !bVar2;
  }
  return bVar2;
}

Assistant:

bool AffixUtils::containsOnlySymbolsAndIgnorables(const UnicodeString& affixPattern,
                                                  const UnicodeSet& ignorables, UErrorCode& status) {
    if (affixPattern.length() == 0) {
        return true;
    };
    AffixTag tag;
    while (hasNext(tag, affixPattern)) {
        tag = nextToken(tag, affixPattern, status);
        if (U_FAILURE(status)) { return false; }
        if (tag.type == TYPE_CODEPOINT && !ignorables.contains(tag.codePoint)) {
            return false;
        }
    }
    return true;
}